

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O3

spvc_result
spvc_compiler_msl_remap_constexpr_sampler
          (spvc_compiler compiler,spvc_variable_id id,spvc_msl_constexpr_sampler *sampler)

{
  spvc_context this;
  spvc_result sVar1;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  MSLConstexprSampler local_88;
  
  if (compiler->backend == SPVC_BACKEND_MSL) {
    local_88.planes = 0;
    local_88.resolution = MSL_FORMAT_RESOLUTION_444;
    local_88.chroma_filter = MSL_SAMPLER_FILTER_NEAREST;
    local_88.x_chroma_offset = MSL_CHROMA_LOCATION_COSITED_EVEN;
    local_88.y_chroma_offset = MSL_CHROMA_LOCATION_COSITED_EVEN;
    local_88.swizzle[0] = MSL_COMPONENT_SWIZZLE_IDENTITY;
    local_88.swizzle[1] = MSL_COMPONENT_SWIZZLE_IDENTITY;
    local_88.swizzle[2] = MSL_COMPONENT_SWIZZLE_IDENTITY;
    local_88.swizzle[3] = MSL_COMPONENT_SWIZZLE_IDENTITY;
    local_88.ycbcr_model = MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY;
    local_88.ycbcr_range = MSL_SAMPLER_YCBCR_RANGE_ITU_FULL;
    local_88.lod_clamp_min = sampler->lod_clamp_min;
    local_88.lod_clamp_max = sampler->lod_clamp_max;
    local_88.compare_enable = sampler->compare_enable != '\0';
    local_88.bpc = 8;
    local_88.lod_clamp_enable = sampler->lod_clamp_enable != '\0';
    local_88.anisotropy_enable = sampler->anisotropy_enable != '\0';
    local_88.ycbcr_conversion_enable = false;
    local_88.max_anisotropy = sampler->max_anisotropy;
    local_88.s_address = sampler->s_address;
    local_88.t_address = sampler->t_address;
    local_88.r_address = sampler->r_address;
    local_88.compare_func = sampler->compare_func;
    local_88.coord = sampler->coord;
    local_88.min_filter = sampler->min_filter;
    local_88.mag_filter = sampler->mag_filter;
    local_88.mip_filter = sampler->mip_filter;
    local_88.border_color = sampler->border_color;
    spirv_cross::CompilerMSL::remap_constexpr_sampler
              ((CompilerMSL *)
               (compiler->compiler)._M_t.
               super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
               .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl,(VariableID)id,
               &local_88);
    sVar1 = SPVC_SUCCESS;
  }
  else {
    this = compiler->context;
    local_a8[0] = local_98;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,"MSL function used on a non-MSL backend.","");
    std::__cxx11::string::operator=((string *)this,(string *)local_a8);
    if (this->callback != (spvc_error_callback)0x0) {
      (*this->callback)(this->callback_userdata,(this->last_error)._M_dataplus._M_p);
    }
    sVar1 = SPVC_ERROR_INVALID_ARGUMENT;
    if (local_a8[0] != local_98) {
      operator_delete(local_a8[0]);
    }
  }
  return sVar1;
}

Assistant:

spvc_result spvc_compiler_msl_remap_constexpr_sampler(spvc_compiler compiler, spvc_variable_id id,
                                                      const spvc_msl_constexpr_sampler *sampler)
{
#if SPIRV_CROSS_C_API_MSL
	if (compiler->backend != SPVC_BACKEND_MSL)
	{
		compiler->context->report_error("MSL function used on a non-MSL backend.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	auto &msl = *static_cast<CompilerMSL *>(compiler->compiler.get());
	MSLConstexprSampler samp;
	spvc_convert_msl_sampler(samp, sampler);
	msl.remap_constexpr_sampler(id, samp);
	return SPVC_SUCCESS;
#else
	(void)id;
	(void)sampler;
	compiler->context->report_error("MSL function used on a non-MSL backend.");
	return SPVC_ERROR_INVALID_ARGUMENT;
#endif
}